

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall
xemmai::ast::t_object_put_indirect::f_flow(t_object_put_indirect *this,t_flow *a_flow)

{
  pointer ptVar1;
  t_flow *a_flow_local;
  t_object_put_indirect *this_local;
  
  ptVar1 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_target);
  (*ptVar1->_vptr_t_node[2])(ptVar1,a_flow);
  ptVar1 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_key);
  (*ptVar1->_vptr_t_node[2])(ptVar1,a_flow);
  ptVar1 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_value);
  (*ptVar1->_vptr_t_node[2])(ptVar1,a_flow);
  return;
}

Assistant:

void t_object_put_indirect::f_flow(t_flow& a_flow)
{
	v_target->f_flow(a_flow);
	v_key->f_flow(a_flow);
	v_value->f_flow(a_flow);
}